

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devices.cc
# Opt level: O0

void __thiscall cnn::Device::~Device(Device *this)

{
  void *in_RDI;
  
  ~Device((Device *)0x65dcc8);
  operator_delete(in_RDI);
  return;
}

Assistant:

Device::~Device() {}